

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O1

int fe_process_frames_int16
              (fe_t *fe,int16 **inout_spch,size_t *inout_nsamps,mfcc_t **buf_cep,
              int32 *inout_nframes)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  size_t sVar4;
  int16 *in;
  uint uVar5;
  int iVar6;
  long lVar7;
  int16 *piVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int32 iVar13;
  
  sVar4 = *inout_nsamps;
  iVar11 = fe->num_overflow_samps;
  lVar12 = (long)iVar11;
  uVar1 = sVar4 + lVar12;
  sVar2 = fe->frame_size;
  uVar9 = (ulong)sVar2;
  if (buf_cep == (mfcc_t **)0x0) {
    if (uVar9 <= uVar1) {
      iVar13 = (int)((uVar1 - uVar9) / (ulong)(long)fe->frame_shift) + 1;
      iVar11 = iVar13;
      goto LAB_00124156;
    }
    iVar13 = 0;
  }
  else if (uVar1 < uVar9) {
    iVar13 = 0;
    if (sVar4 != 0) {
      memcpy(fe->overflow_samps + lVar12,*inout_spch,sVar4 * 2);
      sVar4 = *inout_nsamps;
      fe->num_overflow_samps = fe->num_overflow_samps + (int)sVar4;
      *inout_spch = *inout_spch + sVar4;
      *inout_nsamps = 0;
    }
  }
  else {
    iVar6 = *inout_nframes;
    if (iVar6 < 1) {
      iVar13 = 0;
LAB_001240de:
      iVar11 = 0;
      goto LAB_00124156;
    }
    in = *inout_spch;
    uVar5 = (uint)((uVar1 - uVar9) / (ulong)(long)fe->frame_shift);
    if ((int)(uVar5 + 1) < iVar6) {
      iVar6 = uVar5 + 1;
    }
    if (iVar11 == 0) {
      fe_read_frame_int16(fe,in,(int)sVar2);
      if (0x7ffffffe < uVar5) {
        __assert_fail("outidx < frame_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1ab,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_write_frame(fe,*buf_cep);
      sVar2 = fe->frame_size;
      *inout_spch = *inout_spch + sVar2;
      *inout_nsamps = *inout_nsamps - (long)sVar2;
    }
    else {
      lVar7 = (long)(sVar2 - iVar11);
      memcpy(fe->overflow_samps + lVar12,in,lVar7 * 2);
      fe_read_frame_int16(fe,fe->overflow_samps,(int)fe->frame_size);
      if (0x7ffffffe < uVar5) {
        __assert_fail("outidx < frame_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1a1,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_write_frame(fe,*buf_cep);
      *inout_spch = *inout_spch + lVar7;
      *inout_nsamps = *inout_nsamps - lVar7;
      fe->num_overflow_samps = fe->num_overflow_samps - (int)fe->frame_shift;
    }
    lVar7 = 1;
    if (1 < iVar6) {
      lVar7 = 1;
      do {
        if (*inout_nsamps < (ulong)(long)fe->frame_shift) {
          __assert_fail("*inout_nsamps >= (size_t)fe->frame_shift",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                        ,0x1b5,
                        "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                       );
        }
        fe_shift_frame_int16(fe,*inout_spch,(int)fe->frame_shift);
        fe_write_frame(fe,buf_cep[lVar7]);
        sVar2 = fe->frame_shift;
        *inout_spch = *inout_spch + sVar2;
        *inout_nsamps = *inout_nsamps - (long)sVar2;
        if (0 < fe->num_overflow_samps) {
          fe->num_overflow_samps = fe->num_overflow_samps - (int)sVar2;
        }
        lVar7 = lVar7 + 1;
      } while ((int)lVar7 < iVar6);
    }
    iVar13 = (int32)lVar7;
    lVar7 = (long)fe->num_overflow_samps;
    if (lVar7 < 1) {
      iVar6 = (int)fe->frame_shift;
      iVar11 = (int)*inout_nsamps;
      if (iVar6 <= (int)*inout_nsamps) {
        iVar11 = iVar6;
      }
      lVar7 = (long)fe->frame_size - (long)iVar6;
      fe->num_overflow_samps = (int)lVar7;
      piVar8 = *inout_spch;
      lVar12 = (long)piVar8 - (long)in >> 1;
      if (lVar12 < lVar7) {
        fe->num_overflow_samps = (int)lVar12;
      }
      iVar3 = fe->num_overflow_samps;
      iVar10 = iVar3 + iVar11;
      fe->num_overflow_samps = iVar10;
      if (iVar10 == 0 || SCARRY4(iVar3,iVar11) != iVar10 < 0) goto LAB_00124154;
      memcpy(fe->overflow_samps,piVar8 + ((long)iVar6 - (long)fe->frame_size),
             (ulong)(uint)(iVar10 * 2));
      piVar8 = *inout_spch;
    }
    else {
      memmove(fe->overflow_samps,fe->overflow_samps + (lVar12 - lVar7),lVar7 * 2);
      iVar6 = (int)((ulong)((long)*inout_spch - (long)in) >> 1) + (int)*inout_nsamps;
      iVar11 = (int)fe->frame_size - fe->num_overflow_samps;
      if (iVar6 <= iVar11) {
        iVar11 = iVar6;
      }
      memcpy(fe->overflow_samps + fe->num_overflow_samps,in,(long)iVar11 * 2);
      fe->num_overflow_samps = fe->num_overflow_samps + iVar11;
      piVar8 = *inout_spch;
      lVar12 = (long)piVar8 - (long)in >> 1;
      if (iVar11 <= lVar12) goto LAB_001240de;
      iVar11 = iVar11 - (int)lVar12;
    }
    *inout_spch = piVar8 + iVar11;
    *inout_nsamps = *inout_nsamps - (long)iVar11;
  }
LAB_00124154:
  iVar11 = 0;
LAB_00124156:
  *inout_nframes = iVar13;
  return iVar11;
}

Assistant:

int
fe_process_frames_int16(fe_t *fe,
                  int16 const **inout_spch,
                  size_t *inout_nsamps,
                  mfcc_t **buf_cep,
                  int32 *inout_nframes)
{
    int32 frame_count;
    int outidx, i, n_overflow, orig_n_overflow;
    int16 const *orig_spch;

    /* In the special case where there is no output buffer, return the
     * maximum number of frames which would be generated. */
    if (buf_cep == NULL) {
        if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size)
            *inout_nframes = 0;
        else
            *inout_nframes = 1
                + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
                   / fe->frame_shift);
        return *inout_nframes;
    }

    /* Are there not enough samples to make at least 1 frame? */
    if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size) {
        if (*inout_nsamps > 0) {
            /* Append them to the overflow buffer. */
            memcpy(fe->overflow_samps + fe->num_overflow_samps,
                   *inout_spch, *inout_nsamps * (sizeof(**inout_spch)));
            fe->num_overflow_samps += *inout_nsamps;
            /* Update input-output pointers and counters. */
            *inout_spch += *inout_nsamps;
            *inout_nsamps = 0;
        }
        /* We produced no frames of output, sorry! */
        *inout_nframes = 0;
        return 0;
    }

    /* Can't write a frame?  Then do nothing! */
    if (*inout_nframes < 1) {
        *inout_nframes = 0;
        return 0;
    }

    /* Keep track of the original start of the buffer. */
    orig_spch = *inout_spch;
    orig_n_overflow = fe->num_overflow_samps;
    /* How many frames will we be able to get? */
    frame_count = 1
        + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
           / fe->frame_shift);
    /* Limit it to the number of output frames available. */
    if (frame_count > *inout_nframes)
        frame_count = *inout_nframes;
    /* Index of output frame. */
    outidx = 0;

    /* Start processing, taking care of any incoming overflow. */
    if (fe->num_overflow_samps) {
        int offset = fe->frame_size - fe->num_overflow_samps;

        /* Append start of spch to overflow samples to make a full frame. */
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               *inout_spch, offset * sizeof(**inout_spch));
        fe_read_frame_int16(fe, fe->overflow_samps, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += offset;
        *inout_nsamps -= offset;
        fe->num_overflow_samps -= fe->frame_shift;
    }
    else {
        fe_read_frame_int16(fe, *inout_spch, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_size;
        *inout_nsamps -= fe->frame_size;
    }

    /* Process all remaining frames. */
    for (i = 1; i < frame_count; ++i) {
        assert(*inout_nsamps >= (size_t)fe->frame_shift);

        fe_shift_frame_int16(fe, *inout_spch, fe->frame_shift);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_shift;
        *inout_nsamps -= fe->frame_shift;
        /* Amount of data behind the original input which is still needed. */
        if (fe->num_overflow_samps > 0)
            fe->num_overflow_samps -= fe->frame_shift;
    }

    /* How many relevant overflow samples are there left? */
    if (fe->num_overflow_samps <= 0) {
        /* Maximum number of overflow samples past *inout_spch to save. */
        n_overflow = *inout_nsamps;
        if (n_overflow > fe->frame_shift)
            n_overflow = fe->frame_shift;
        fe->num_overflow_samps = fe->frame_size - fe->frame_shift;
        /* Make sure this isn't an illegal read! */
        if (fe->num_overflow_samps > *inout_spch - orig_spch)
            fe->num_overflow_samps = *inout_spch - orig_spch;
        fe->num_overflow_samps += n_overflow;
        if (fe->num_overflow_samps > 0) {
            memcpy(fe->overflow_samps,
                   *inout_spch - (fe->frame_size - fe->frame_shift),
                   fe->num_overflow_samps * sizeof(**inout_spch));
            /* Update the input pointer to cover this stuff. */
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }
    else {
        /* There is still some relevant data left in the overflow buffer. */
        /* Shift existing data to the beginning. */
        memmove(fe->overflow_samps,
                fe->overflow_samps + orig_n_overflow - fe->num_overflow_samps,
                fe->num_overflow_samps * sizeof(*fe->overflow_samps));
        /* Copy in whatever we had in the original speech buffer. */
        n_overflow = *inout_spch - orig_spch + *inout_nsamps;
        if (n_overflow > fe->frame_size - fe->num_overflow_samps)
            n_overflow = fe->frame_size - fe->num_overflow_samps;
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               orig_spch, n_overflow * sizeof(*orig_spch));
        fe->num_overflow_samps += n_overflow;
        /* Advance the input pointers. */
        if (n_overflow > *inout_spch - orig_spch) {
            n_overflow -= (*inout_spch - orig_spch);
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }

    /* Finally update the frame counter with the number of frames we processed. */
    *inout_nframes = outidx; /* FIXME: Not sure why I wrote it this way... */
    return 0;
}